

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O2

Var Js::Math::Imul(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int32 iVar4;
  int32 iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  undefined1 *puVar8;
  int in_stack_00000010;
  undefined1 local_40 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x714,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bd88f2;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_40,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  if ((local_40._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x715,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00bd88f2;
    *puVar6 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x718,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bd88f2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  puVar8 = &DAT_1000000000000;
  if (2 < (local_40._0_4_ & 0xffffff)) {
    pvVar7 = Arguments::operator[]((Arguments *)local_40,1);
    iVar4 = JavascriptConversion::ToInt32(pvVar7,pSVar1);
    pvVar7 = Arguments::operator[]((Arguments *)local_40,2);
    iVar5 = JavascriptConversion::ToInt32(pvVar7,pSVar1);
    puVar8 = (undefined1 *)((ulong)(uint)(iVar5 * iVar4) | 0x1000000000000);
  }
  return puVar8;
}

Assistant:

Var Math::Imul(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Math_Constructor_imul);

        if (args.Info.Count >= 3)
        {
            int32 x = JavascriptConversion::ToInt32(args[1], scriptContext);
            int32 y = JavascriptConversion::ToInt32(args[2], scriptContext);

            int64 int64Result = (int64)x * (int64)y;
            int32 result = (int32)int64Result;

            return JavascriptNumber::ToVar(result, scriptContext);
        }
        else
        {
            // The arguments, if left unspecified default to undefined, and ToUint32(undefined) produces +0.
            // Therefore we return +0, not NaN here like the other Math functions.
            return TaggedInt::ToVarUnchecked(0);
        }
    }